

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cc
# Opt level: O3

void __thiscall AVO::Agent::Agent(Agent *this)

{
  Vector2::Vector2(&this->newVelocity_);
  Vector2::Vector2(&this->position_);
  Vector2::Vector2(&this->prefVelocity_);
  Vector2::Vector2(&this->velocity_);
  (this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  this->radius_ = 0.0;
  this->timeHorizon_ = 0.0;
  (this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  this->accelInterval_ = 0.0;
  this->maxAccel_ = 0.0;
  this->maxSpeed_ = 0.0;
  this->neighborDist_ = 0.0;
  this->id_ = 0;
  this->maxNeighbors_ = 0;
  (this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>::_M_initialize_map
            (&(this->boundary_).super__Deque_base<AVO::Vector2,_std::allocator<AVO::Vector2>_>,0);
  (this->orcaLines_).super__Vector_base<AVO::Line,_std::allocator<AVO::Line>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orcaLines_).super__Vector_base<AVO::Line,_std::allocator<AVO::Line>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->agentNeighbors_).
  super__Vector_base<std::pair<float,_const_AVO::Agent_*>,_std::allocator<std::pair<float,_const_AVO::Agent_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->orcaLines_).super__Vector_base<AVO::Line,_std::allocator<AVO::Line>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->agentNeighbors_).
  super__Vector_base<std::pair<float,_const_AVO::Agent_*>,_std::allocator<std::pair<float,_const_AVO::Agent_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->agentNeighbors_).
  super__Vector_base<std::pair<float,_const_AVO::Agent_*>,_std::allocator<std::pair<float,_const_AVO::Agent_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Agent::Agent()
    : id_(0U),
      maxNeighbors_(0U),
      accelInterval_(0.0F),
      maxAccel_(0.0F),
      maxSpeed_(0.0F),
      neighborDist_(0.0F),
      radius_(0.0F),
      timeHorizon_(0.0F) {}